

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O1

void __thiscall EmmyDebuggerManager::HandleBreak(EmmyDebuggerManager *this,lua_State *L)

{
  undefined8 this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<Debugger> debugger;
  undefined1 local_48 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  GetDebugger((EmmyDebuggerManager *)local_48,(lua_State *)this);
  if ((Debugger *)local_48._0_8_ == (Debugger *)0x0) {
    AddDebugger((EmmyDebuggerManager *)(local_48 + 0x20),(lua_State *)this);
    _Var1._M_pi = _Stack_20._M_pi;
    local_48._0_8_ = local_48._32_8_;
    this_00 = local_48._8_8_;
    local_48._32_8_ = (Debugger *)0x0;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48._8_8_ = _Var1._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
    }
  }
  else {
    Debugger::SetCurrentState((Debugger *)local_48._0_8_,L);
  }
  local_48._16_8_ = local_48._0_8_;
  local_48._24_8_ = local_48._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_48._8_8_ + 8) = *(_Atomic_word *)(local_48._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_48._8_8_ + 8) = *(_Atomic_word *)(local_48._8_8_ + 8) + 1;
    }
  }
  SetHitDebugger(this,(shared_ptr<Debugger> *)(local_48 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._24_8_);
  }
  Debugger::HandleBreak((Debugger *)local_48._0_8_);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  return;
}

Assistant:

void EmmyDebuggerManager::HandleBreak(lua_State* L)
{
	auto debugger = GetDebugger(L);

	if (debugger)
	{
		debugger->SetCurrentState(L);
	}
	else
	{
		debugger = AddDebugger(L);
	}

	SetHitDebugger(debugger);

	debugger->HandleBreak();
}